

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_mem_legacy.c
# Opt level: O1

RK_S32 put_used_memory_handle(vpu_display_mem_pool *p,void *hdl)

{
  long lVar1;
  
  lVar1 = *(long *)((long)hdl + 0x18);
  if (((byte)vpu_mem_debug & 1) != 0) {
    _mpp_log_l(4,0,"pool %p hnd %p buffer %p\n","put_used_memory_handle",p,hdl,lVar1);
  }
  if (lVar1 != 0) {
    mpp_buffer_put_with_caller(lVar1,"put_used_memory_handle");
    *(undefined8 *)hdl = 0;
    *(undefined8 *)((long)hdl + 8) = 0;
    *(undefined8 *)((long)hdl + 0x10) = 0;
    *(undefined8 *)((long)hdl + 0x18) = 0;
  }
  return 0;
}

Assistant:

static RK_S32 put_used_memory_handle(vpu_display_mem_pool *p, void *hdl)
{
    VPUMemLinear_t *dmabuf = (VPUMemLinear_t *)hdl;
    MppBuffer buf = (MppBuffer)dmabuf->offset;
    vpu_mem_dbg_func("pool %p hnd %p buffer %p\n", p, hdl, buf);
    if (buf != NULL) {
        mpp_buffer_put(buf);
        memset(dmabuf, 0, sizeof(VPUMemLinear_t));
    }
    (void)p;
    return MPP_OK;
}